

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O1

void test_epoll_wait_interrupted(void)

{
  cio_error cVar1;
  cio_eventloop loop;
  cio_eventloop local_4f0;
  
  epoll_wait_fake.custom_fake = notify_no_fd_interrupt;
  memset(&local_4f0,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_4f0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x24e,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)epoll_create1_fake.call_count,(char *)0x0,0x24f,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_run(&local_4f0);
  UnityAssertEqualNumber
            (2,(ulong)epoll_wait_fake.call_count,(char *)0x0,0x252,UNITY_DISPLAY_STYLE_INT);
  cio_eventloop_destroy(&local_4f0);
  UnityAssertEqualNumber(2,(ulong)close_fake.call_count,(char *)0x0,0x255,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_epoll_wait_interrupted(void)
{
	epoll_wait_fake.custom_fake = notify_no_fd_interrupt;

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	TEST_ASSERT_EQUAL(1, epoll_create1_fake.call_count);

	cio_eventloop_run(&loop);
	TEST_ASSERT_EQUAL(2, epoll_wait_fake.call_count);

	cio_eventloop_destroy(&loop);
	TEST_ASSERT_EQUAL(2, close_fake.call_count);
}